

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrExternalCameraExtrinsicsOCULUS *value
               ,string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  bool bVar1;
  invalid_argument *this;
  XrGeneratedDispatchTable *gen_dispatch_table_00;
  XrExternalCameraExtrinsicsOCULUS *in_stack_ffffffffffffff08;
  allocator local_e9;
  string relativepose_prefix;
  string attachedtodevice_prefix;
  string camerastatusflags_prefix;
  string lastchangetime_prefix;
  undefined1 local_68 [32];
  string local_48;
  
  PointerToHexString<XrExternalCameraExtrinsicsOCULUS>(in_stack_ffffffffffffff08);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,&lastchangetime_prefix);
  std::__cxx11::string::~string((string *)&lastchangetime_prefix);
  std::__cxx11::string::append((char *)prefix);
  std::__cxx11::string::string((string *)&lastchangetime_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&lastchangetime_prefix);
  std::__cxx11::to_string(&camerastatusflags_prefix,value->lastChangeTime);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[7],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [7])"XrTime",&lastchangetime_prefix,&camerastatusflags_prefix);
  std::__cxx11::string::~string((string *)&camerastatusflags_prefix);
  std::__cxx11::string::string((string *)&camerastatusflags_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&camerastatusflags_prefix);
  std::__cxx11::to_string(&attachedtodevice_prefix,value->cameraStatusFlags);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[34],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [34])"XrExternalCameraStatusFlagsOCULUS",
             &camerastatusflags_prefix,&attachedtodevice_prefix);
  std::__cxx11::string::~string((string *)&attachedtodevice_prefix);
  std::__cxx11::string::string((string *)&attachedtodevice_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&attachedtodevice_prefix);
  std::__cxx11::to_string(&relativepose_prefix,value->attachedToDevice);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[39],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [39])"XrExternalCameraAttachedToDeviceOCULUS",
             &attachedtodevice_prefix,&relativepose_prefix);
  std::__cxx11::string::~string((string *)&relativepose_prefix);
  std::__cxx11::string::string((string *)&relativepose_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&relativepose_prefix);
  std::__cxx11::string::string((string *)(local_68 + 0x20),(string *)&relativepose_prefix);
  gen_dispatch_table_00 = (XrGeneratedDispatchTable *)local_68;
  std::__cxx11::string::string((string *)gen_dispatch_table_00,"XrPosef",&local_e9);
  bVar1 = ApiDumpOutputXrStruct
                    (gen_dispatch_table_00,&value->relativePose,(string *)(local_68 + 0x20),
                     (string *)local_68,false,contents);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(local_68 + 0x20));
  if (bVar1) {
    std::__cxx11::string::~string((string *)&relativepose_prefix);
    std::__cxx11::string::~string((string *)&attachedtodevice_prefix);
    std::__cxx11::string::~string((string *)&camerastatusflags_prefix);
    std::__cxx11::string::~string((string *)&lastchangetime_prefix);
    return true;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"Invalid Operation");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrExternalCameraExtrinsicsOCULUS* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string lastchangetime_prefix = prefix;
        lastchangetime_prefix += "lastChangeTime";
        contents.emplace_back("XrTime", lastchangetime_prefix, std::to_string(value->lastChangeTime));
        std::string camerastatusflags_prefix = prefix;
        camerastatusflags_prefix += "cameraStatusFlags";
        contents.emplace_back("XrExternalCameraStatusFlagsOCULUS", camerastatusflags_prefix, std::to_string(value->cameraStatusFlags));
        std::string attachedtodevice_prefix = prefix;
        attachedtodevice_prefix += "attachedToDevice";
        contents.emplace_back("XrExternalCameraAttachedToDeviceOCULUS", attachedtodevice_prefix, std::to_string(value->attachedToDevice));
        std::string relativepose_prefix = prefix;
        relativepose_prefix += "relativePose";
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->relativePose, relativepose_prefix, "XrPosef", false, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        return true;
    } catch(...) {
    }
    return false;
}